

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullTypeHandler.cpp
# Opt level: O0

BOOL __thiscall Js::NullTypeHandlerBase::Seal(NullTypeHandlerBase *this,DynamicObject *instance)

{
  int iVar1;
  DictionaryTypeHandler *pDVar2;
  DynamicObject *instance_local;
  NullTypeHandlerBase *this_local;
  
  pDVar2 = ConvertToDictionaryType(this,instance);
  iVar1 = (*(pDVar2->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x37])(pDVar2,instance);
  return iVar1;
}

Assistant:

BOOL NullTypeHandlerBase::Seal(DynamicObject* instance)
    {
        return ConvertToDictionaryType(instance)->Seal(instance);
    }